

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

size_t V_GetDim(Vector *V)

{
  LASErrIdType LVar1;
  size_t local_18;
  size_t Dim;
  Vector *V_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    local_18 = V->Dim;
  }
  else {
    local_18 = 0;
  }
  return local_18;
}

Assistant:

size_t V_GetDim(Vector *V)
/* returns dimension of the vector V */
{
    size_t Dim;

    if (LASResult() == LASOK)
        Dim = V->Dim;
    else
        Dim = 0;
    return(Dim);
}